

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.c
# Opt level: O2

void push_job(parse_t *ps)

{
  code *pcVar1;
  size_t sVar2;
  pmtr_t *ppVar3;
  ctor_f *pcVar4;
  uint uVar5;
  char *pcVar6;
  UT_array *pUVar7;
  job_t *pjVar8;
  uint uVar9;
  bool bVar10;
  
  if (ps->job->name == (char *)0x0) {
    utstring_printf(ps->em,"job has no name");
    ps->rc = -1;
    return;
  }
  if (ps->rc == -1) {
    return;
  }
  pjVar8 = ps->job;
  uVar9 = (pjVar8->cmdv).n;
  uVar5 = (pjVar8->cmdv).i + 1;
  if (uVar9 < uVar5) {
    while (uVar9 < uVar5) {
      bVar10 = uVar9 == 0;
      uVar9 = uVar9 * 2;
      if (bVar10) {
        uVar9 = 8;
      }
      (pjVar8->cmdv).n = uVar9;
    }
    pcVar6 = (char *)realloc((pjVar8->cmdv).d,(ulong)uVar9 * (pjVar8->cmdv).icd.sz);
    pjVar8 = ps->job;
    (pjVar8->cmdv).d = pcVar6;
    if (pcVar6 == (char *)0x0) goto LAB_001047ed;
  }
  pcVar1 = (code *)(pjVar8->cmdv).icd.init;
  sVar2 = (pjVar8->cmdv).icd.sz;
  if (pcVar1 == (code *)0x0) {
    memset((pjVar8->cmdv).d + (pjVar8->cmdv).i * sVar2,0,sVar2);
  }
  else {
    (*pcVar1)();
  }
  pUVar7 = &ps->job->cmdv;
  pUVar7->i = pUVar7->i + 1;
  pUVar7 = ps->cfg->jobs;
  uVar9 = pUVar7->n;
  uVar5 = pUVar7->i + 1;
  if (uVar9 < uVar5) {
    while (uVar9 < uVar5) {
      bVar10 = uVar9 == 0;
      uVar9 = uVar9 * 2;
      if (bVar10) {
        uVar9 = 8;
      }
      pUVar7->n = uVar9;
    }
    pcVar6 = (char *)realloc(pUVar7->d,(ulong)uVar9 * (pUVar7->icd).sz);
    ppVar3 = ps->cfg;
    ppVar3->jobs->d = pcVar6;
    if (pcVar6 == (char *)0x0) {
LAB_001047ed:
      exit(-1);
    }
    pUVar7 = ppVar3->jobs;
  }
  sVar2 = (pUVar7->icd).sz;
  uVar9 = pUVar7->i;
  pcVar4 = (pUVar7->icd).copy;
  pUVar7->i = uVar9 + 1;
  if (pcVar4 == (ctor_f *)0x0) {
    memcpy(pUVar7->d + uVar9 * sVar2,ps->job,sVar2);
  }
  else {
    (*pcVar4)(pUVar7->d + uVar9 * sVar2,ps->job);
  }
  job_fin(ps->job);
  job_ini(ps->job);
  return;
}

Assistant:

void push_job(parse_t *ps) {

  /* final validation */
  if (!ps->job->name) {
      utstring_printf(ps->em, "job has no name");
      ps->rc = -1;
  }

  if (ps->rc == -1) return;

  /* okay. polish it off and copy it into the jobs */
  utarray_extend_back(&ps->job->cmdv); /* put NULL on end of argv */
  utarray_push_back(ps->cfg->jobs, ps->job);
  /* reset job for another parse */
  job_fin(ps->job); 
  job_ini(ps->job);
}